

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAdda<(moira::Instr)5,(moira::Mode)3,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  u32 uVar2;
  ulong uVar3;
  int iVar4;
  u32 data;
  u32 ea;
  u32 local_20;
  u32 local_1c;
  
  bVar1 = readOp<(moira::Mode)3,(moira::Size)2,0ul>(this,opcode & 7,&local_1c,&local_20);
  if (bVar1) {
    uVar3 = (ulong)(opcode >> 9 & 7);
    local_20 = (u32)(short)local_20;
    iVar4 = local_20 + *(int *)((long)this->exec + uVar3 * 4 + -0x38);
    uVar2 = (this->reg).pc;
    (this->reg).pc0 = uVar2;
    (this->queue).ird = (this->queue).irc;
    uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar2 + 2);
    (this->queue).irc = (u16)uVar2;
    (*this->_vptr_Moira[0x19])(this,2);
    (*this->_vptr_Moira[0x19])(this,2);
    *(int *)((long)this->exec + uVar3 * 4 + -0x38) = iVar4;
  }
  return;
}

Assistant:

void
Moira::execAdda(u16 opcode)
{
    u32 ea, data, result;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;
    data = SEXT<S>(data);

    result = (I == ADDA) ? readA(dst) + data : readA(dst) - data;
    prefetch<POLLIPL>();

    sync(2);
    if (S == Word || isRegMode(M) || isImmMode(M)) sync(2);
    writeA(dst, result);
}